

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_3000_3999.cpp
# Opt level: O0

void __thiscall psy::C::ParserTester::case3013(ParserTester *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  Expectation *pEVar1;
  allocator<psy::C::SyntaxKind> local_1f1;
  SyntaxKind local_1f0 [8];
  iterator local_1e0;
  size_type local_1d8;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1d0;
  Expectation local_1b8;
  Expectation local_100;
  allocator<char> local_31;
  string local_30;
  ParserTester *local_10;
  ParserTester *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"offsetof ( struct x , y  [ 0 ] . z )",&local_31);
  Expectation::Expectation(&local_1b8);
  local_1f0[0] = OffsetOfExpression;
  local_1f0[1] = 0x47f;
  local_1f0[2] = 0x403;
  local_1f0[3] = 0x413;
  local_1f0[4] = 0x421;
  local_1f0[5] = 0x420;
  local_1f0[6] = 0x422;
  local_1f0[7] = 0x41f;
  local_1e0 = local_1f0;
  local_1d8 = 8;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_1f1);
  __l._M_len = local_1d8;
  __l._M_array = local_1e0;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            (&local_1d0,__l,&local_1f1);
  pEVar1 = Expectation::AST(&local_1b8,&local_1d0);
  Expectation::Expectation(&local_100,pEVar1);
  parseExpression(this,&local_30,&local_100);
  Expectation::~Expectation(&local_100);
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector(&local_1d0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_1f1);
  Expectation::~Expectation(&local_1b8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  return;
}

Assistant:

void ParserTester::case3013()
{
    parseExpression("offsetof ( struct x , y  [ 0 ] . z )",
                    Expectation().AST( { SyntaxKind::OffsetOfExpression,
                                         SyntaxKind::TypeName,
                                         SyntaxKind::StructTypeSpecifier,
                                         SyntaxKind::AbstractDeclarator,
                                         SyntaxKind::OffsetOfDesignator,
                                         SyntaxKind::ArrayDesignator,
                                         SyntaxKind::IntegerConstantExpression,
                                         SyntaxKind::FieldDesignator }));
}